

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzmaEnc.cpp
# Opt level: O0

void crnlib::LzmaEnc_Init(CLzmaEnc *p)

{
  undefined4 uVar1;
  undefined4 uVar2;
  long in_RDI;
  UInt32 j_1;
  UInt16 *probs;
  UInt32 num;
  UInt32 j;
  UInt32 i;
  undefined4 local_24;
  undefined4 local_10;
  undefined4 local_c;
  
  *(undefined4 *)(in_RDI + 0x32f80) = 0;
  for (local_c = 0; local_c < 4; local_c = local_c + 1) {
    *(undefined4 *)(in_RDI + 0x32f70 + (ulong)local_c * 4) = 0;
  }
  RangeEnc_Init((CRangeEnc *)(in_RDI + 0x3d2e8));
  for (local_c = 0; local_c < 0xc; local_c = local_c + 1) {
    for (local_10 = 0; local_10 < 0x10; local_10 = local_10 + 1) {
      *(undefined2 *)(in_RDI + 0x33be8 + (ulong)local_c * 0x20 + (ulong)local_10 * 2) = 0x400;
      *(undefined2 *)(in_RDI + 0x33dc8 + (ulong)local_c * 0x20 + (ulong)local_10 * 2) = 0x400;
    }
    *(undefined2 *)(in_RDI + 0x33d68 + (ulong)local_c * 2) = 0x400;
    *(undefined2 *)(in_RDI + 0x33d80 + (ulong)local_c * 2) = 0x400;
    *(undefined2 *)(in_RDI + 0x33d98 + (ulong)local_c * 2) = 0x400;
    *(undefined2 *)(in_RDI + 0x33db0 + (ulong)local_c * 2) = 0x400;
  }
  uVar1 = *(undefined4 *)(in_RDI + 0x33bd0);
  uVar2 = *(undefined4 *)(in_RDI + 0x33bcc);
  for (local_c = 0; local_c < (uint)(0x300 << ((char)uVar1 + (char)uVar2 & 0x1fU));
      local_c = local_c + 1) {
    *(undefined2 *)(*(long *)(in_RDI + 0x33be0) + (ulong)local_c * 2) = 0x400;
  }
  for (local_c = 0; local_c < 4; local_c = local_c + 1) {
    for (local_24 = 0; local_24 < 0x40; local_24 = local_24 + 1) {
      *(undefined2 *)(in_RDI + 0x33f48 + (ulong)local_c * 0x80 + (ulong)local_24 * 2) = 0x400;
    }
  }
  for (local_c = 0; local_c < 0x72; local_c = local_c + 1) {
    *(undefined2 *)(in_RDI + 0x34148 + (ulong)local_c * 2) = 0x400;
  }
  LenEnc_Init((CLenEnc *)(in_RDI + 0x3424c));
  LenEnc_Init((CLenEnc *)(in_RDI + 0x38a94));
  for (local_c = 0; local_c < 0x10; local_c = local_c + 1) {
    *(undefined2 *)(in_RDI + 0x3422c + (ulong)local_c * 2) = 0x400;
  }
  *(undefined4 *)(in_RDI + 0x4c0) = 0;
  *(undefined4 *)(in_RDI + 0x4c4) = 0;
  *(undefined4 *)(in_RDI + 0x32f6c) = 0;
  *(int *)(in_RDI + 0x33bdc) = (1 << ((byte)*(undefined4 *)(in_RDI + 0x33bd4) & 0x1f)) + -1;
  *(int *)(in_RDI + 0x33bd8) = (1 << ((byte)*(undefined4 *)(in_RDI + 0x33bd0) & 0x1f)) + -1;
  return;
}

Assistant:

void LzmaEnc_Init(CLzmaEnc* p) {
  UInt32 i;
  p->state = 0;
  for (i = 0; i < LZMA_NUM_REPS; i++)
    p->reps[i] = 0;

  RangeEnc_Init(&p->rc);

  for (i = 0; i < kNumStates; i++) {
    UInt32 j;
    for (j = 0; j < LZMA_NUM_PB_STATES_MAX; j++) {
      p->isMatch[i][j] = kProbInitValue;
      p->isRep0Long[i][j] = kProbInitValue;
    }
    p->isRep[i] = kProbInitValue;
    p->isRepG0[i] = kProbInitValue;
    p->isRepG1[i] = kProbInitValue;
    p->isRepG2[i] = kProbInitValue;
  }

  {
    UInt32 num = 0x300 << (p->lp + p->lc);
    for (i = 0; i < num; i++)
      p->litProbs[i] = kProbInitValue;
  }

  {
    for (i = 0; i < kNumLenToPosStates; i++) {
      CLzmaProb* probs = p->posSlotEncoder[i];
      UInt32 j;
      for (j = 0; j < (1 << kNumPosSlotBits); j++)
        probs[j] = kProbInitValue;
    }
  }
  {
    for (i = 0; i < kNumFullDistances - kEndPosModelIndex; i++)
      p->posEncoders[i] = kProbInitValue;
  }

  LenEnc_Init(&p->lenEnc.p);
  LenEnc_Init(&p->repLenEnc.p);

  for (i = 0; i < (1 << kNumAlignBits); i++)
    p->posAlignEncoder[i] = kProbInitValue;

  p->optimumEndIndex = 0;
  p->optimumCurrentIndex = 0;
  p->additionalOffset = 0;

  p->pbMask = (1 << p->pb) - 1;
  p->lpMask = (1 << p->lp) - 1;
}